

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

Diagnostics * __thiscall slang::ast::Compilation::getAllDiagnostics(Compilation *this)

{
  optional<slang::Diagnostics> *this_00;
  Diagnostics *pDVar1;
  
  this_00 = &this->cachedAllDiagnostics;
  if ((this->cachedAllDiagnostics).super__Optional_base<slang::Diagnostics,_false,_false>._M_payload
      .super__Optional_payload<slang::Diagnostics,_true,_false,_false>.
      super__Optional_payload_base<slang::Diagnostics>._M_engaged == false) {
    std::optional<slang::Diagnostics>::emplace<>(this_00);
    pDVar1 = getParseDiagnostics(this);
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,pDVar1);
    pDVar1 = getSemanticDiagnostics(this);
    SmallVectorBase<slang::Diagnostic>::append<slang::Diagnostics>
              ((SmallVectorBase<slang::Diagnostic> *)this_00,pDVar1);
    if (this->sourceManager != (SourceManager *)0x0) {
      Diagnostics::sort((Diagnostics *)this_00,this->sourceManager);
    }
  }
  return (Diagnostics *)this_00;
}

Assistant:

const Diagnostics& Compilation::getAllDiagnostics() {
    if (cachedAllDiagnostics)
        return *cachedAllDiagnostics;

    cachedAllDiagnostics.emplace();
    cachedAllDiagnostics->append(getParseDiagnostics());
    cachedAllDiagnostics->append(getSemanticDiagnostics());

    if (sourceManager)
        cachedAllDiagnostics->sort(*sourceManager);
    return *cachedAllDiagnostics;
}